

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O3

ParamGenerator<(anonymous_namespace)::TestVideoParam>
testing::ValuesIn<(anonymous_namespace)::TestVideoParam,3ul>
          (anon_struct_40_9_5a18a00c_for__M_head_impl (*array) [3])

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined **ppuVar4;
  _func_int *p_Var5;
  byte bVar6;
  ParamGenerator<(anonymous_namespace)::TestVideoParam> PVar7;
  
  bVar6 = 0;
  pp_Var1 = (_func_int **)operator_new(0x20);
  *pp_Var1 = (_func_int *)&PTR__ValuesInIteratorRangeGenerator_0104a5a8;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  p_Var2 = (_func_int *)operator_new(0x78);
  pp_Var1[1] = p_Var2;
  pp_Var1[3] = p_Var2 + 0x78;
  ppuVar4 = &::(anonymous_namespace)::kTestVectors;
  p_Var5 = p_Var2;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined **)p_Var5 = *ppuVar4;
    ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
    p_Var5 = p_Var5 + (ulong)bVar6 * -0x10 + 8;
  }
  pp_Var1[2] = p_Var2 + 0x78;
  (*array)[0].filename = (char *)pp_Var1;
  ((anon_struct_40_9_5a18a00c_for__M_head_impl *)((long)array + 0))->width = 0;
  ((anon_struct_40_9_5a18a00c_for__M_head_impl *)((long)array + 0))->height = 0;
  PVar7.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(0x18);
  PVar7.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[1]._vptr_ParamGeneratorInterface = (_func_int **)0x100000001;
  (PVar7.impl_.
   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr)->_vptr_ParamGeneratorInterface = (_func_int **)&PTR___Sp_counted_base_0104a670;
  PVar7.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[2]._vptr_ParamGeneratorInterface = pp_Var1;
  *(element_type **)&(*array)[0].width =
       PVar7.impl_.
       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  PVar7.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  return (ParamGenerator<(anonymous_namespace)::TestVideoParam>)
         PVar7.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}